

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::RecordTargetProgress
          (cmGlobalUnixMakefileGenerator3 *this,cmMakefileTargetGenerator *tg)

{
  unsigned_long uVar1;
  string local_48;
  cmGeneratorTarget *local_28;
  mapped_type *local_20;
  TargetProgress *tp;
  cmMakefileTargetGenerator *tg_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  tp = (TargetProgress *)tg;
  tg_local = (cmMakefileTargetGenerator *)this;
  local_28 = cmMakefileTargetGenerator::GetGeneratorTarget(tg);
  local_20 = std::
             map<const_cmGeneratorTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmGeneratorTarget::StrictTargetComparison,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
             ::operator[](&this->ProgressMap,&local_28);
  uVar1 = (**(code **)(tp->NumberOfActions + 0x20))();
  local_20->NumberOfActions = uVar1;
  cmMakefileTargetGenerator::GetProgressFileNameFull_abi_cxx11_
            (&local_48,(cmMakefileTargetGenerator *)tp);
  std::__cxx11::string::operator=((string *)&local_20->VariableFile,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::RecordTargetProgress(
  cmMakefileTargetGenerator* tg)
{
  TargetProgress& tp = this->ProgressMap[tg->GetGeneratorTarget()];
  tp.NumberOfActions = tg->GetNumberOfProgressActions();
  tp.VariableFile = tg->GetProgressFileNameFull();
}